

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder.cc
# Opt level: O3

VerifyError * __thiscall
bssl::CertPathBuilderResultPath::GetVerifyError
          (VerifyError *__return_storage_ptr__,CertPathBuilderResultPath *this)

{
  CertPathErrors *this_00;
  bool bVar1;
  ParsedCertificate *pPVar2;
  _Storage<const_void_*,_true> _Var3;
  StatusCode code;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  optional<const_void_*> oVar6;
  string diagnostic;
  ptrdiff_t depth;
  string local_280;
  ptrdiff_t local_260;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  this_00 = &this->errors;
  CertPathErrors::ToDebugString_abi_cxx11_(&local_280,this_00,&this->certs);
  bVar1 = CertPathErrors::ContainsAnyErrorWithSeverity(this_00,SEVERITY_HIGH);
  if (bVar1) {
    bVar1 = CertPathErrors::ContainsError(this_00,"Internal error");
    if ((bVar1) || (bVar1 = CertPathErrors::ContainsError(this_00,"Chain is empty"), bVar1)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p == &local_280.field_2) {
        local_1f8.field_2._8_8_ = local_280.field_2._8_8_;
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      }
      else {
        local_1f8._M_dataplus._M_p = local_280._M_dataplus._M_p;
      }
      local_1f8.field_2._M_allocated_capacity._1_7_ = local_280.field_2._M_allocated_capacity._1_7_;
      local_1f8.field_2._M_local_buf[0] = local_280.field_2._M_local_buf[0];
      local_1f8._M_string_length = local_280._M_string_length;
      local_280._M_string_length = 0;
      local_280.field_2._M_local_buf[0] = '\0';
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      VerifyError::VerifyError(__return_storage_ptr__,VERIFICATION_FAILURE,-1,&local_1f8);
      local_1d8.field_2._M_allocated_capacity = local_1f8.field_2._M_allocated_capacity;
      _Var4._M_p = local_1f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) goto LAB_004ac9f3;
    }
    else {
      bVar1 = CertPathErrors::ContainsError(this_00,"Deadline exceeded");
      if (bVar1) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p == &local_280.field_2) {
          local_218.field_2._8_8_ = local_280.field_2._8_8_;
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        }
        else {
          local_218._M_dataplus._M_p = local_280._M_dataplus._M_p;
        }
        local_218.field_2._M_allocated_capacity._1_7_ =
             local_280.field_2._M_allocated_capacity._1_7_;
        local_218.field_2._M_local_buf[0] = local_280.field_2._M_local_buf[0];
        local_218._M_string_length = local_280._M_string_length;
        local_280._M_string_length = 0;
        local_280.field_2._M_local_buf[0] = '\0';
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        VerifyError::VerifyError(__return_storage_ptr__,PATH_DEADLINE_EXCEEDED,-1,&local_218);
        local_1d8.field_2._M_allocated_capacity = local_218.field_2._M_allocated_capacity;
        _Var4._M_p = local_218._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_004ac9f3;
      }
      else {
        bVar1 = CertPathErrors::ContainsError(this_00,"Iteration limit exceeded");
        if (bVar1) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p == &local_280.field_2) {
            local_238.field_2._8_8_ = local_280.field_2._8_8_;
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          }
          else {
            local_238._M_dataplus._M_p = local_280._M_dataplus._M_p;
          }
          local_238.field_2._M_allocated_capacity._1_7_ =
               local_280.field_2._M_allocated_capacity._1_7_;
          local_238.field_2._M_local_buf[0] = local_280.field_2._M_local_buf[0];
          local_238._M_string_length = local_280._M_string_length;
          local_280._M_string_length = 0;
          local_280.field_2._M_local_buf[0] = '\0';
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          VerifyError::VerifyError
                    (__return_storage_ptr__,PATH_ITERATION_COUNT_EXCEEDED,-1,&local_238);
          local_1d8.field_2._M_allocated_capacity = local_238.field_2._M_allocated_capacity;
          _Var4._M_p = local_238._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p == &local_238.field_2) goto LAB_004ac9f3;
        }
        else {
          bVar1 = CertPathErrors::ContainsError(this_00,"Depth limit exceeded");
          if (bVar1) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p == &local_280.field_2) {
              local_258.field_2._8_8_ = local_280.field_2._8_8_;
              local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            }
            else {
              local_258._M_dataplus._M_p = local_280._M_dataplus._M_p;
            }
            local_258.field_2._M_allocated_capacity._1_7_ =
                 local_280.field_2._M_allocated_capacity._1_7_;
            local_258.field_2._M_local_buf[0] = local_280.field_2._M_local_buf[0];
            local_258._M_string_length = local_280._M_string_length;
            local_280._M_string_length = 0;
            local_280.field_2._M_local_buf[0] = '\0';
            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
            VerifyError::VerifyError(__return_storage_ptr__,PATH_DEPTH_LIMIT_REACHED,-1,&local_258);
            local_1d8.field_2._M_allocated_capacity = local_258.field_2._M_allocated_capacity;
            _Var4._M_p = local_258._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p == &local_258.field_2) goto LAB_004ac9f3;
          }
          else {
            local_260 = -1;
            oVar6 = CertPathErrors::FindSingleHighSeverityError(this_00,&local_260);
            _Var3 = oVar6.super__Optional_base<const_void_*,_true,_true>._M_payload.
                    super__Optional_payload_base<const_void_*>._M_payload;
            if (((undefined1  [16])
                 oVar6.super__Optional_base<const_void_*,_true,_true>._M_payload.
                 super__Optional_payload_base<const_void_*> & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) {
              paVar5 = &local_38.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_38.field_2._8_8_ = local_280.field_2._8_8_;
                local_38._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_38._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_38._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError(__return_storage_ptr__,PATH_MULTIPLE_ERRORS,-1,&local_38);
              _Var4._M_p = local_38._M_dataplus._M_p;
            }
            else if ((char *)_Var3._M_value == "Time is after notAfter") {
              paVar5 = &local_58.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_58.field_2._8_8_ = local_280.field_2._8_8_;
                local_58._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_58._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_58._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_EXPIRED,local_260,&local_58);
              _Var4._M_p = local_58._M_dataplus._M_p;
            }
            else if ((char *)_Var3._M_value == "Time is before notBefore") {
              paVar5 = &local_78.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_78.field_2._8_8_ = local_280.field_2._8_8_;
                local_78._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_78._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_78._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_NOT_YET_VALID,local_260,&local_78);
              _Var4._M_p = local_78._M_dataplus._M_p;
            }
            else if (((((char *)_Var3._M_value == "Distrusted by trust store") ||
                      ((char *)_Var3._M_value == "Certificate is not a trust anchor")) ||
                     ((char *)_Var3._M_value == "max_path_length reached")) ||
                    (((char *)_Var3._M_value == "subject does not match issuer" ||
                     ((char *)_Var3._M_value == "No matching issuer found")))) {
              paVar5 = &local_98.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_98.field_2._8_8_ = local_280.field_2._8_8_;
                local_98._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_98._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_98._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError(__return_storage_ptr__,PATH_NOT_FOUND,local_260,&local_98);
              _Var4._M_p = local_98._M_dataplus._M_p;
            }
            else if ((char *)_Var3._M_value == "VerifySignedData failed") {
              paVar5 = &local_b8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_b8.field_2._8_8_ = local_280.field_2._8_8_;
                local_b8._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_b8._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_b8._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_INVALID_SIGNATURE,local_260,&local_b8);
              _Var4._M_p = local_b8._M_dataplus._M_p;
            }
            else if ((char *)_Var3._M_value == "Unacceptable signature algorithm") {
              paVar5 = &local_d8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_d8.field_2._8_8_ = local_280.field_2._8_8_;
                local_d8._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_d8._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_d8._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_UNSUPPORTED_SIGNATURE_ALGORITHM,
                         local_260,&local_d8);
              _Var4._M_p = local_d8._M_dataplus._M_p;
            }
            else if ((char *)_Var3._M_value == "Unacceptable public key") {
              paVar5 = &local_f8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_f8.field_2._8_8_ = local_280.field_2._8_8_;
                local_f8._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_f8._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_f8._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_UNSUPPORTED_KEY,local_260,&local_f8);
              _Var4._M_p = local_f8._M_dataplus._M_p;
            }
            else if ((((char *)_Var3._M_value ==
                       "The extended key usage does not include server auth") ||
                     ((char *)_Var3._M_value ==
                      "The extended key usage does not include server auth but instead includes anyExtendeKeyUsage"
                     )) || (((char *)_Var3._M_value ==
                             "The extended key usage does not include client auth" ||
                            (((char *)_Var3._M_value ==
                              "The extended key usage does not include client auth but instead includes anyExtendedKeyUsage"
                             || ((char *)_Var3._M_value ==
                                 "The extended key usage does not include client auth or server auth"
                                )))))) {
              paVar5 = &local_118.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_118.field_2._8_8_ = local_280.field_2._8_8_;
                local_118._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_118._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_118._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_NO_MATCHING_EKU,local_260,&local_118);
              _Var4._M_p = local_118._M_dataplus._M_p;
            }
            else if ((char *)_Var3._M_value == "Certificate is revoked") {
              paVar5 = &local_138.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_138.field_2._8_8_ = local_280.field_2._8_8_;
                local_138._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_138._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_138._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_REVOKED,local_260,&local_138);
              _Var4._M_p = local_138._M_dataplus._M_p;
            }
            else if ((char *)_Var3._M_value == "Certificate lacks a revocation mechanism") {
              paVar5 = &local_158.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_158.field_2._8_8_ = local_280.field_2._8_8_;
                local_158._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_158._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_158._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_NO_REVOCATION_MECHANISM,local_260,
                         &local_158);
              _Var4._M_p = local_158._M_dataplus._M_p;
            }
            else if ((char *)_Var3._M_value == "Unable to check revocation") {
              paVar5 = &local_178.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_178.field_2._8_8_ = local_280.field_2._8_8_;
                local_178._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_178._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_178._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_UNABLE_TO_CHECK_REVOCATION,local_260,
                         &local_178);
              _Var4._M_p = local_178._M_dataplus._M_p;
            }
            else {
              code = CERTIFICATE_INVALID;
              if (local_260 < 0) {
                code = VERIFICATION_FAILURE;
              }
              paVar5 = &local_198.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p == &local_280.field_2) {
                local_198.field_2._8_8_ = local_280.field_2._8_8_;
                local_198._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_198._M_dataplus._M_p = local_280._M_dataplus._M_p;
              }
              local_198._M_string_length = local_280._M_string_length;
              local_280._M_string_length = 0;
              local_280.field_2._M_local_buf[0] = '\0';
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              VerifyError::VerifyError(__return_storage_ptr__,code,local_260,&local_198);
              _Var4._M_p = local_198._M_dataplus._M_p;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var4._M_p == paVar5) goto LAB_004ac9f3;
            local_1d8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          }
        }
      }
    }
  }
  else {
    pPVar2 = GetTrustedCert(this);
    paVar5 = &local_280.field_2;
    if (pPVar2 == (ParsedCertificate *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p == paVar5) {
        local_1d8.field_2._8_8_ = local_280.field_2._8_8_;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      }
      else {
        local_1d8._M_dataplus._M_p = local_280._M_dataplus._M_p;
      }
      local_1d8.field_2._M_allocated_capacity._1_7_ = local_280.field_2._M_allocated_capacity._1_7_;
      local_1d8.field_2._M_local_buf[0] = local_280.field_2._M_local_buf[0];
      local_1d8._M_string_length = local_280._M_string_length;
      local_280._M_string_length = 0;
      local_280.field_2._M_local_buf[0] = '\0';
      local_280._M_dataplus._M_p = (pointer)paVar5;
      VerifyError::VerifyError(__return_storage_ptr__,VERIFICATION_FAILURE,-1,&local_1d8);
      _Var4._M_p = local_1d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_004ac9f3;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p == paVar5) {
        local_1b8.field_2._8_8_ = local_280.field_2._8_8_;
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8._M_dataplus._M_p = local_280._M_dataplus._M_p;
      }
      local_1b8.field_2._M_allocated_capacity._1_7_ = local_280.field_2._M_allocated_capacity._1_7_;
      local_1b8.field_2._M_local_buf[0] = local_280.field_2._M_local_buf[0];
      local_1b8._M_string_length = local_280._M_string_length;
      local_280._M_string_length = 0;
      local_280.field_2._M_local_buf[0] = '\0';
      local_280._M_dataplus._M_p = (pointer)paVar5;
      VerifyError::VerifyError(__return_storage_ptr__,PATH_VERIFIED,0,&local_1b8);
      local_1d8.field_2._M_allocated_capacity = local_1b8.field_2._M_allocated_capacity;
      _Var4._M_p = local_1b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) goto LAB_004ac9f3;
    }
  }
  operator_delete(_Var4._M_p,local_1d8.field_2._M_allocated_capacity + 1);
LAB_004ac9f3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

VerifyError CertPathBuilderResultPath::GetVerifyError() const {
  // Diagnostic string is always "everything" about the path.
  std::string diagnostic = errors.ToDebugString(certs);
  if (!errors.ContainsHighSeverityErrors()) {
    // TODO(bbe3): Having to check this after seems awkward: crbug.com/boringssl/713
    if (GetTrustedCert()) {
      return VerifyError(VerifyError::StatusCode::PATH_VERIFIED, 0,
                         std::move(diagnostic));
    } else {
      return VerifyError(VerifyError::StatusCode::VERIFICATION_FAILURE, -1,
                         std::move(diagnostic));
    }
  }

  // Check for the presence of things that amount to Internal errors in the
  // verification code. We deliberately prioritize this to not hide it in
  // multiple error cases.
  if (errors.ContainsError(cert_errors::kInternalError) ||
      errors.ContainsError(cert_errors::kChainIsEmpty)) {
    return VerifyError(VerifyError::StatusCode::VERIFICATION_FAILURE, -1,
                       std::move(diagnostic));
  }

  // Similarly, for the deadline and limit cases, there will often be other
  // errors that we probably do not care about, since path building was
  // aborted. Surface these errors instead of having them hidden in the multiple
  // error case.
  //
  // Normally callers should check for these in the path builder result before
  // calling this on a single path, but this is here in case they do not and
  // these errors are actually present on this path.
  if (errors.ContainsError(cert_errors::kDeadlineExceeded)) {
    return VerifyError(VerifyError::StatusCode::PATH_DEADLINE_EXCEEDED, -1,
                       std::move(diagnostic));
  }
  if (errors.ContainsError(cert_errors::kIterationLimitExceeded)) {
    return VerifyError(VerifyError::StatusCode::PATH_ITERATION_COUNT_EXCEEDED,
                       -1, std::move(diagnostic));
  }
  if (errors.ContainsError(cert_errors::kDepthLimitExceeded)) {
    return VerifyError(VerifyError::StatusCode::PATH_DEPTH_LIMIT_REACHED, -1,
                       std::move(diagnostic));
  }

  // If the chain has multiple high severity errors, indicate that.
  ptrdiff_t depth = -1;
  std::optional<CertErrorId> single_error =
      errors.FindSingleHighSeverityError(depth);
  if (!single_error.has_value()) {
    return VerifyError(VerifyError::StatusCode::PATH_MULTIPLE_ERRORS, -1,
                       std::move(diagnostic));
  }

  // Otherwise it has a single error, map it appropriately at the
  // depth it first occurs.
  if (single_error.value() == cert_errors::kValidityFailedNotAfter) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_EXPIRED, depth,
                       std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kValidityFailedNotBefore) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_NOT_YET_VALID,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kDistrustedByTrustStore ||
      single_error.value() == cert_errors::kCertIsNotTrustAnchor ||
      single_error.value() == cert_errors::kMaxPathLengthViolated ||
      single_error.value() == cert_errors::kSubjectDoesNotMatchIssuer ||
      single_error.value() == cert_errors::kNoIssuersFound) {
    return VerifyError(VerifyError::StatusCode::PATH_NOT_FOUND, depth,
                       std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kVerifySignedDataFailed) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_INVALID_SIGNATURE,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kUnacceptableSignatureAlgorithm) {
    return VerifyError(
        VerifyError::StatusCode::CERTIFICATE_UNSUPPORTED_SIGNATURE_ALGORITHM,
        depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kUnacceptablePublicKey) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_UNSUPPORTED_KEY,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kEkuLacksServerAuth ||
      single_error.value() == cert_errors::kEkuLacksServerAuthButHasAnyEKU ||
      single_error.value() == cert_errors::kEkuLacksClientAuth ||
      single_error.value() == cert_errors::kEkuLacksClientAuthButHasAnyEKU ||
      single_error.value() == cert_errors::kEkuLacksClientAuthOrServerAuth) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_NO_MATCHING_EKU,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kCertificateRevoked) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_REVOKED, depth,
                       std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kNoRevocationMechanism) {
    return VerifyError(
        VerifyError::StatusCode::CERTIFICATE_NO_REVOCATION_MECHANISM, depth,
        std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kUnableToCheckRevocation) {
    return VerifyError(
        VerifyError::StatusCode::CERTIFICATE_UNABLE_TO_CHECK_REVOCATION, depth,
        std::move(diagnostic));
  }
  // All other High severity errors map to CERTIFICATE_INVALID if associated
  // to a certificate, or VERIFICATION_FAILURE if not associated to a
  // certificate.
  return VerifyError((depth < 0) ? VerifyError::StatusCode::VERIFICATION_FAILURE
                                 : VerifyError::StatusCode::CERTIFICATE_INVALID,
                     depth, std::move(diagnostic));
}